

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O1

ALLEGRO_FS_ENTRY * fs_stdio_create_entry(char *orig_path)

{
  WRAP_CHAR *abs_path;
  ALLEGRO_FS_ENTRY *pAVar1;
  
  abs_path = make_absolute_path(orig_path);
  if (abs_path == (WRAP_CHAR *)0x0) {
    pAVar1 = (ALLEGRO_FS_ENTRY *)0x0;
  }
  else {
    pAVar1 = create_abs_path_entry(abs_path);
    free(abs_path);
  }
  return pAVar1;
}

Assistant:

static ALLEGRO_FS_ENTRY *fs_stdio_create_entry(const char *orig_path)
{
   ALLEGRO_FS_ENTRY *ret = NULL;
   WRAP_CHAR *abs_path;

   abs_path = make_absolute_path(orig_path);
   if (abs_path) {
      ret = create_abs_path_entry(abs_path);
      free(abs_path);
   }
   return ret;
}